

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O1

bool __thiscall
Diligent::DeviceObjectArchive::ResourceData::operator==(ResourceData *this,ResourceData *Other)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  SerializedData *Rhs;
  SerializedData *this_00;
  
  bVar2 = SerializedData::operator==(&this->Common,&Other->Common);
  if ((!bVar2) ||
     (bVar2 = SerializedData::operator==
                        ((SerializedData *)&this->DeviceSpecific,
                         (SerializedData *)&Other->DeviceSpecific), !bVar2)) {
    return false;
  }
  Rhs = (SerializedData *)&(Other->DeviceSpecific).field_0x20;
  this_00 = (SerializedData *)&(this->DeviceSpecific).field_0x20;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 6) break;
    bVar2 = SerializedData::operator==(this_00,Rhs);
    Rhs = Rhs + 1;
    this_00 = this_00 + 1;
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return 5 < uVar3;
}

Assistant:

bool operator==(const ResourceData& Other) const noexcept
        {
            if (Common != Other.Common)
                return false;

            for (size_t i = 0; i < DeviceSpecific.size(); ++i)
            {
                if (DeviceSpecific[i] != Other.DeviceSpecific[i])
                    return false;
            }

            return true;
        }